

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestreamout_array.hpp
# Opt level: O0

BOOL __thiscall ByteStreamOutArray::putByte(ByteStreamOutArray *this,U8 byte)

{
  U8 *pUVar1;
  U8 byte_local;
  ByteStreamOutArray *this_local;
  
  if (this->curr == this->alloc) {
    this->alloc = this->alloc + 0x1000;
    pUVar1 = (U8 *)realloc_las(this->data,this->alloc & 0xffffffff);
    this->data = pUVar1;
    if (this->data == (U8 *)0x0) {
      return false;
    }
  }
  this->data[this->curr] = byte;
  if (this->curr == this->size) {
    this->size = this->size + 1;
  }
  this->curr = this->curr + 1;
  return true;
}

Assistant:

inline BOOL ByteStreamOutArray::putByte(U8 byte)
{
  if (curr == alloc)
  {
    alloc += 4096;
    data = (U8*)realloc_las(data, (U32)alloc);
    if (data == 0)
    {
      return FALSE;
    }
  }
  data[curr] = byte;
  if (curr == size) size++;
  curr++;
  return TRUE;
}